

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

String * __thiscall String::compress(String *__return_storage_ptr__,String *this)

{
  int iVar1;
  uint uVar2;
  z_stream stream;
  char buffer [32768];
  pointer local_8098;
  undefined8 uStack_8090;
  undefined8 local_8088;
  char *pcStack_8080;
  undefined8 local_8078;
  undefined8 uStack_8070;
  undefined8 local_8068;
  undefined8 uStack_8060;
  undefined8 local_8058;
  undefined8 uStack_8050;
  undefined8 local_8048;
  undefined8 uStack_8040;
  undefined8 local_8038;
  undefined8 uStack_8030;
  char local_8028 [32776];
  
  if ((this->mString)._M_string_length != 0) {
    local_8038 = 0;
    uStack_8030 = 0;
    local_8048 = 0;
    uStack_8040 = 0;
    local_8058 = 0;
    uStack_8050 = 0;
    local_8068 = 0;
    uStack_8060 = 0;
    local_8078 = 0;
    uStack_8070 = 0;
    local_8088 = 0;
    pcStack_8080 = (char *)0x0;
    local_8098 = (pointer)0x0;
    uStack_8090 = 0;
    iVar1 = deflateInit_(&local_8098,9,"1.2.11",0x70);
    if (iVar1 == 0) {
      local_8098 = (this->mString)._M_dataplus._M_p;
      uStack_8090 = CONCAT44(uStack_8090._4_4_,(int)(this->mString)._M_string_length);
      (__return_storage_ptr__->mString)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->mString).field_2;
      (__return_storage_ptr__->mString)._M_string_length = 0;
      (__return_storage_ptr__->mString).field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
      do {
        local_8078 = CONCAT44(local_8078._4_4_,0x8000);
        pcStack_8080 = local_8028;
        uVar2 = deflate(&local_8098,4);
        if (1 < uVar2) {
          (__return_storage_ptr__->mString)._M_string_length = 0;
          *(__return_storage_ptr__->mString)._M_dataplus._M_p = '\0';
          break;
        }
        append(__return_storage_ptr__,local_8028,(long)(0x8000 - (int)local_8078));
      } while ((int)local_8078 == 0);
      deflateEnd(&local_8098);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->mString)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mString).field_2;
  (__return_storage_ptr__->mString)._M_string_length = 0;
  (__return_storage_ptr__->mString).field_2._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

String String::compress() const
{
#ifndef RCT_HAVE_ZLIB
    assert(0 && "Rct configured without zlib support");
    return String();
#else
    if (isEmpty())
        return String();
    z_stream stream;
    memset(&stream, 0, sizeof(stream));

    if (::deflateInit(&stream, Z_BEST_COMPRESSION) != Z_OK)
        return String();

    stream.next_in = const_cast<Bytef*>(reinterpret_cast<const Bytef *>(data()));
    stream.avail_in = size();

    char buffer[BufferSize];

    String out;
    out.reserve(size() / 2);

    int error = 0;
    do {
        stream.next_out = reinterpret_cast<Bytef *>(buffer);
        stream.avail_out = sizeof(buffer);

        error = ::deflate(&stream, Z_FINISH);
        if (error != Z_OK && error != Z_STREAM_END) {
            out.clear();
            break;
        }

        const int processed = sizeof(buffer) - stream.avail_out;
        out.append(buffer, processed);
    } while (!stream.avail_out);

    deflateEnd(&stream);

    return out;
#endif
}